

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O0

MMDB_entry_data_s *
data_ok(MMDB_entry_data_s *__return_storage_ptr__,MMDB_lookup_result_s *result,uint32_t expect_type,
       char *description,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_3c;
  undefined1 local_38 [4];
  int status;
  va_list keys;
  char *description_local;
  uint32_t expect_type_local;
  MMDB_lookup_result_s *result_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  keys[0].overflow_arg_area = local_f8;
  keys[0]._0_8_ = &stack0x00000008;
  status = 0x30;
  local_38 = (undefined1  [4])0x20;
  local_d8 = in_R8;
  local_d0 = in_R9;
  keys[0].reg_save_area = description;
  local_3c = MMDB_vget_value(&result->entry,__return_storage_ptr__,(__va_list_tag *)local_38);
  iVar1 = cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                        ,0xe0,local_3c,"==",0,"no error from call to MMDB_vget_value - %s",
                        keys[0].reg_save_area,0);
  if (iVar1 == 0) {
    pcVar2 = MMDB_strerror(local_3c);
    diag("  error from MMDB_vget_value - %s",pcVar2);
  }
  else {
    iVar1 = cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                          ,0xe6,__return_storage_ptr__->type,"==",expect_type,
                          "got the expected data type - %s",keys[0].reg_save_area,0);
    if (iVar1 == 0) {
      diag("  data type value is %i but expected %i",(ulong)__return_storage_ptr__->type,
           (ulong)expect_type);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MMDB_entry_data_s data_ok(MMDB_lookup_result_s *result,
                          uint32_t expect_type,
                          const char *description,
                          ...) {
    va_list keys;
    va_start(keys, description);

    MMDB_entry_data_s data;
    int status = MMDB_vget_value(&result->entry, &data, keys);

    va_end(keys);

    if (cmp_ok(status,
               "==",
               MMDB_SUCCESS,
               "no error from call to MMDB_vget_value - %s",
               description)) {

        if (!cmp_ok((int)data.type,
                    "==",
                    (int)expect_type,
                    "got the expected data type - %s",
                    description)) {

            diag("  data type value is %i but expected %i",
                 data.type,
                 expect_type);
        }
    } else {
        diag("  error from MMDB_vget_value - %s", MMDB_strerror(status));
    }

    return data;
}